

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

void __thiscall
testing::ScopedTrace::ScopedTrace(ScopedTrace *this,char *file,int line,string *message)

{
  string *in_RCX;
  int in_EDX;
  char *in_RSI;
  ScopedTrace *in_RDI;
  string local_40 [2];
  
  std::__cxx11::string::string((string *)local_40,in_RCX);
  PushTrace(in_RDI,in_RSI,in_EDX,local_40);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

ScopedTrace(const char* file, int line, const std::string& message) {
    PushTrace(file, line, message);
  }